

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

value * __thiscall
mjs::interpreter::impl::top_level_eval
          (value *__return_storage_ptr__,impl *this,statement *s,bool allow_return)

{
  bool bVar1;
  value_type vVar2;
  object_ptr *error;
  wostream *os;
  native_error_exception *this_00;
  wstring local_250 [32];
  wstring_view local_230;
  wstring local_220;
  wstring_view local_200;
  wostringstream local_1f0 [8];
  wostringstream woss;
  undefined1 local_68 [8];
  completion c;
  bool allow_return_local;
  statement *s_local;
  impl *this_local;
  
  c.target._M_str._7_1_ = allow_return;
  eval((completion *)local_68,this,s);
  if (local_68._0_4_ != throw_) {
    if (((c.target._M_str._7_1_ & 1) == 0) || (local_68._0_4_ != return_)) {
      bVar1 = completion::operator_cast_to_bool((completion *)local_68);
      if (bVar1) {
        std::__cxx11::wostringstream::wostringstream(local_1f0);
        os = std::operator<<((wostream *)local_1f0,
                             "Top level evaluation resulted in abrupt termination: ");
        mjs::operator<<(os,(completion *)local_68);
        this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
        stack_trace_abi_cxx11_(&local_220,this);
        local_200 = (wstring_view)
                    std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_220)
        ;
        std::__cxx11::wostringstream::str();
        local_230 = (wstring_view)
                    std::__cxx11::wstring::operator_cast_to_basic_string_view(local_250);
        native_error_exception::native_error_exception(this_00,eval,&local_200,&local_230);
        __cxa_throw(this_00,&native_error_exception::typeinfo,
                    native_error_exception::~native_error_exception);
      }
      value::value(__return_storage_ptr__,(value *)value::undefined);
    }
    else {
      value::value(__return_storage_ptr__,(value *)&c);
    }
    completion::~completion((completion *)local_68);
    return __return_storage_ptr__;
  }
  vVar2 = value::type((value *)&c);
  if (vVar2 == object) {
    error = value::object_value((value *)&c);
    rethrow_error(error);
  }
  __assert_fail("c.result.type() == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                ,0x1ab,"value mjs::interpreter::impl::top_level_eval(const statement &, bool)");
}

Assistant:

value top_level_eval(const statement& s, bool allow_return = true) {
        auto c = eval(s);
        // ES3, 13.2.1 [[Call]]
        if (c.type == completion_type::throw_) {
            assert(c.result.type() == value_type::object);
            rethrow_error(c.result.object_value());
        } else if  (allow_return && c.type == completion_type::return_) {
            return c.result;
        } else if (!c) {
            // Don't let normal completion values escape
            return value::undefined;
        }
        std::wostringstream woss;
        woss << "Top level evaluation resulted in abrupt termination: " << c;
        throw native_error_exception(native_error_type::eval, stack_trace(), woss.str());
    }